

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_simplex_and_subfaces<int[2]>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,int (*Nsimplex) [2],
          Filtration_value *filtration)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Vertex_handle VVar4;
  iterator iVar5;
  reference piVar6;
  iterator iVar7;
  difference_type dVar8;
  int *piVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_00;
  undefined8 extraout_RDX;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar11;
  int local_d8;
  undefined1 local_d1;
  undefined8 *local_d0;
  int local_c4;
  iterator iStack_c0;
  Vertex_handle v;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  const_iterator local_90;
  int *local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_unique;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  const_iterator local_50;
  bool local_41;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_40;
  int *local_38;
  int *last;
  int *first;
  Filtration_value *filtration_local;
  int (*Nsimplex_local) [2];
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  undefined8 uVar10;
  
  filtration_local = filtration;
  Nsimplex_local = Nsimplex;
  this_local = this;
  last = std::begin<int_const,2ul>((int (*) [2])filtration);
  local_38 = std::end<int_const,2ul>((int (*) [2])filtration_local);
  if (last == local_38) {
    null_simplex();
    local_41 = true;
    std::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
                *)this,&local_40,&local_41);
    uVar10 = extraout_RDX;
  }
  else {
    if ((char)in_FS_OFFSET[-0x19] == '\0') {
      lVar2 = *in_FS_OFFSET;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(lVar2 + -0xe0));
      __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,
                          (vector<int,_std::allocator<int>_> *)(lVar2 + -0xe0),&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
    }
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    lVar2 = *in_FS_OFFSET;
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
               &local_58);
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,std::allocator<int>> *)(lVar2 + -0xe0),local_50,last,local_38);
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    last_unique._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
               last_unique);
    local_80._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    local_78 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (local_80,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_88);
    lVar2 = *in_FS_OFFSET;
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_90,
               &local_78);
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
               &local_a0);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)(lVar2 + -0xe0),local_90,local_98);
    lVar2 = *in_FS_OFFSET;
    __end0 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)(lVar2 + -0xe0));
    iStack_c0 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(lVar2 + -0xe0));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff40);
      if (!bVar3) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      iVar1 = *piVar6;
      local_c4 = iVar1;
      VVar4 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)Nsimplex);
      local_d1 = 0;
      if (iVar1 == VVar4) {
        local_d0 = (undefined8 *)__cxa_allocate_exception(8);
        local_d1 = 1;
        *local_d0 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_d0,&char_const*::typeinfo,0);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    iVar7 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    dVar8 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar5._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar7._M_current);
    local_d8 = (int)dVar8 + -1;
    piVar9 = std::max<int>(Nsimplex[0x10],&local_d8);
    Nsimplex[0x10][0] = *piVar9;
    first_00._M_current = (int *)root((Simplex_tree<Gudhi::Simplex_tree_options_default> *)Nsimplex)
    ;
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    iVar7 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0xe0));
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,first_00,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        iVar5._M_current,(Filtration_value *)iVar7._M_current);
    uVar10 = pVar11._8_8_;
  }
  pVar11._8_8_ = uVar10;
  pVar11.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }